

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O2

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_miter
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double dx1,double dy1,double dx2,double dy2,line_join_e lj,double mlimit,
          double dbevel)

{
  double x;
  bool bVar1;
  double dVar2;
  double y;
  undefined8 in_XMM1_Qb;
  double dVar3;
  double dVar4;
  double y_00;
  double yi;
  double xi;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  undefined8 uStack_50;
  double local_40;
  double local_38;
  
  local_78 = v1->x;
  local_80 = v1->y;
  dVar2 = this->m_width_abs * mlimit;
  local_70 = dx1;
  local_68 = dy2;
  local_58 = dy1;
  uStack_50 = in_XMM1_Qb;
  local_40 = mlimit;
  local_38 = dbevel;
  bVar1 = calc_intersection(v0->x + dx1,v0->y - dy1,local_78 + dx1,local_80 - dy1,local_78 + dx2,
                            local_80 - dy2,v2->x + dx2,v2->y - dy2,&local_78,&local_80);
  x = v1->x;
  if (bVar1) {
    y_00 = v1->y;
    dVar4 = SQRT((local_78 - x) * (local_78 - x) + (local_80 - y_00) * (local_80 - y_00));
    dVar3 = local_78;
    y = local_80;
    if (dVar4 <= dVar2) goto LAB_00115750;
  }
  else {
    dVar3 = x + local_70;
    y_00 = v1->y;
    y = y_00 - local_58;
    if ((y_00 - v0->y) * (dVar3 - x) - (x - v0->x) * (y - y_00) < 0.0 !=
        0.0 <= (v2->y - y_00) * (dVar3 - v2->x) - (v2->x - x) * (y - v2->y)) goto LAB_00115750;
    dVar4 = 1.0;
  }
  if (lj == miter_join_round) {
    calc_arc(this,vc,x,y_00,local_70,-local_58,dx2,-local_68);
    return;
  }
  if (lj == miter_join_revert) {
    add_vertex(this,vc,x + local_70,y_00 - local_58);
    dVar3 = dx2 + v1->x;
    y = v1->y - local_68;
  }
  else if (bVar1) {
    dVar3 = y_00 - local_58;
    local_58 = y_00 - local_68;
    uStack_50 = 0;
    dVar2 = (dVar2 - local_38) / (dVar4 - local_38);
    add_vertex(this,vc,(local_78 - (local_70 + x)) * dVar2 + local_70 + x,
               (local_80 - dVar3) * dVar2 + dVar3);
    dVar3 = (local_78 - (dx2 + x)) * dVar2 + dx2 + x;
    y = (local_80 - local_58) * dVar2 + local_58;
  }
  else {
    dVar2 = (double)this->m_width_sign * local_40;
    add_vertex(this,vc,local_58 * dVar2 + x + local_70,local_70 * dVar2 + (y_00 - local_58));
    dVar3 = (v1->x + dx2) - local_68 * dVar2;
    y = (v1->y - local_68) - dVar2 * dx2;
  }
LAB_00115750:
  add_vertex(this,vc,dVar3,y);
  return;
}

Assistant:

void math_stroke<VC>::calc_miter(VC& vc,
                                     const vertex_dist& v0, 
                                     const vertex_dist& v1, 
                                     const vertex_dist& v2,
                                     double dx1, double dy1, 
                                     double dx2, double dy2,
                                     line_join_e lj,
                                     double mlimit,
                                     double dbevel)
    {
        double xi  = v1.x;
        double yi  = v1.y;
        double di  = 1;
        double lim = m_width_abs * mlimit;
        bool miter_limit_exceeded = true; // Assume the worst
        bool intersection_failed  = true; // Assume the worst

        if(calc_intersection(v0.x + dx1, v0.y - dy1,
                             v1.x + dx1, v1.y - dy1,
                             v1.x + dx2, v1.y - dy2,
                             v2.x + dx2, v2.y - dy2,
                             &xi, &yi))
        {
            // Calculation of the intersection succeeded
            //---------------------
            di = calc_distance(v1.x, v1.y, xi, yi);
            if(di <= lim)
            {
                // Inside the miter limit
                //---------------------
                add_vertex(vc, xi, yi);
                miter_limit_exceeded = false;
            }
            intersection_failed = false;
        }
        else
        {
            // Calculation of the intersection failed, most probably
            // the three points lie one straight line. 
            // First check if v0 and v2 lie on the opposite sides of vector: 
            // (v1.x, v1.y) -> (v1.x+dx1, v1.y-dy1), that is, the perpendicular
            // to the line determined by vertices v0 and v1.
            // This condition determines whether the next line segments continues
            // the previous one or goes back.
            //----------------
            double x2 = v1.x + dx1;
            double y2 = v1.y - dy1;
            if((cross_product(v0.x, v0.y, v1.x, v1.y, x2, y2) < 0.0) == 
               (cross_product(v1.x, v1.y, v2.x, v2.y, x2, y2) < 0.0))
            {
                // This case means that the next segment continues 
                // the previous one (straight line)
                //-----------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                miter_limit_exceeded = false;
            }
        }

        if(miter_limit_exceeded)
        {
            // Miter limit exceeded
            //------------------------
            switch(lj)
            {
            case miter_join_revert:
                // For the compatibility with SVG, PDF, etc, 
                // we use a simple bevel join instead of
                // "smart" bevel
                //-------------------
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case miter_join_round:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default:
                // If no miter-revert, calculate new dx1, dy1, dx2, dy2
                //----------------
                if(intersection_failed)
                {
                    mlimit *= m_width_sign;
                    add_vertex(vc, v1.x + dx1 + dy1 * mlimit, 
                                   v1.y - dy1 + dx1 * mlimit);
                    add_vertex(vc, v1.x + dx2 - dy2 * mlimit, 
                                   v1.y - dy2 - dx2 * mlimit);
                }
                else
                {
                    double x1 = v1.x + dx1;
                    double y1 = v1.y - dy1;
                    double x2 = v1.x + dx2;
                    double y2 = v1.y - dy2;
                    di = (lim - dbevel) / (di - dbevel);
                    add_vertex(vc, x1 + (xi - x1) * di, 
                                   y1 + (yi - y1) * di);
                    add_vertex(vc, x2 + (xi - x2) * di, 
                                   y2 + (yi - y2) * di);
                }
                break;
            }
        }
    }